

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::clear(Functions *gl,Vec4 *color)

{
  glClearColorFunc p_Var1;
  GLenum err;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 *color_local;
  Functions *gl_local;
  
  p_Var1 = gl->clearColor;
  fVar2 = tcu::Vector<float,_4>::x(color);
  fVar3 = tcu::Vector<float,_4>::y(color);
  fVar4 = tcu::Vector<float,_4>::z(color);
  fVar5 = tcu::Vector<float,_4>::w(color);
  (*p_Var1)(fVar2,fVar3,fVar4,fVar5);
  (*gl->clear)(0x4000);
  err = (*gl->getError)();
  glu::checkError(err,"Color clear failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xd8);
  return;
}

Assistant:

void clear (const glw::Functions& gl, const tcu::Vec4& color)
{
	gl.clearColor(color.x(), color.y(), color.z(), color.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Color clear failed");
}